

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

int CompareToUpperCaseString(uint8_t *tld,size_t length,char *target)

{
  uint8_t *x;
  size_t j;
  int ret;
  char *target_local;
  size_t length_local;
  uint8_t *tld_local;
  
  j._4_4_ = 0;
  x = (uint8_t *)0x0;
  do {
    if (length <= x) {
LAB_001921e5:
      if (((j._4_4_ == 0) && (x == (uint8_t *)length)) && (target[(long)x] != '\0')) {
        j._4_4_ = -1;
      }
      return j._4_4_;
    }
    if (target[(long)x] == '\0') {
      j._4_4_ = 1;
      goto LAB_001921e5;
    }
    if (target[(long)x] != tld[(long)x]) {
      j._4_4_ = 1;
      if (tld[(long)x] < (byte)target[(long)x]) {
        j._4_4_ = -1;
      }
      goto LAB_001921e5;
    }
    x = x + 1;
  } while( true );
}

Assistant:

static int CompareToUpperCaseString(const uint8_t * tld, size_t length, const char * target)
{
    int ret = 0;
    size_t j = 0;
    uint8_t * x = (uint8_t *)target;

    for (; j < length; j++)
    {
        if (x[j] == 0)
        {
            ret = 1; /* Target string is longer, thus larger */
            break;
        }
        else if (x[j] != tld[j]) {
            ret = (tld[j] < x[j]) ? -1 : 1;
            break;
        }
    }

    if (ret == 0 && j == length && x[j] != 0)
    {
        ret = -1; /* Target string is shorter, thus lower */
    }

    return ret;
}